

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
array<CEnvPoint,_allocator_default<CEnvPoint>_>::alloc
          (array<CEnvPoint,_allocator_default<CEnvPoint>_> *this,int new_len)

{
  uint uVar1;
  int iVar2;
  CEnvPoint *pCVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  undefined4 *puVar7;
  undefined4 *puVar8;
  byte bVar9;
  
  bVar9 = 0;
  this->list_size = new_len;
  pCVar3 = allocator_default<CEnvPoint>::alloc_array(new_len);
  uVar1 = this->list_size;
  if (this->num_elements < this->list_size) {
    uVar1 = this->num_elements;
  }
  uVar6 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar6;
  }
  for (; uVar4 * 0x58 - uVar6 != 0; uVar6 = uVar6 + 0x58) {
    puVar7 = (undefined4 *)((long)(this->list->super_CEnvPoint_v1).m_aValues + (uVar6 - 8));
    puVar8 = (undefined4 *)((long)(pCVar3->super_CEnvPoint_v1).m_aValues + (uVar6 - 8));
    for (lVar5 = 0x16; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar8 = *puVar7;
      puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
      puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
    }
  }
  allocator_default<CEnvPoint>::free_array(this->list);
  iVar2 = this->list_size;
  if (this->num_elements < this->list_size) {
    iVar2 = this->num_elements;
  }
  this->num_elements = iVar2;
  this->list = pCVar3;
  return;
}

Assistant:

void alloc(int new_len)
	{
		list_size = new_len;
		T *new_list = ALLOCATOR::alloc_array(list_size);

		int end = num_elements < list_size ? num_elements : list_size;
		for(int i = 0; i < end; i++)
			new_list[i] = list[i];

		ALLOCATOR::free_array(list);

		num_elements = num_elements < list_size ? num_elements : list_size;
		list = new_list;
	}